

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

ostream * tchecker::parsing::operator<<(ostream *os,attributes_t *attr)

{
  bool bVar1;
  size_t sVar2;
  attr_t *attr_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_true>
  local_28;
  const_iterator_t it;
  attributes_t *attr_local;
  ostream *os_local;
  
  it.super_const_iterator.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_true>
  ._M_cur = (const_iterator)(const_iterator)attr;
  sVar2 = attributes_t::size(attr);
  if (sVar2 != 0) {
    std::operator<<(os,"{");
    local_28._M_cur =
         (__node_type *)
         attributes_t::begin((attributes_t *)
                             it.super_const_iterator.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_true>
                             ._M_cur);
    while( true ) {
      local_30._M_cur =
           (__node_type *)
           attributes_t::end((attributes_t *)
                             it.super_const_iterator.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_true>
                             ._M_cur);
      bVar1 = std::__detail::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      local_38._M_cur =
           (__node_type *)
           attributes_t::begin((attributes_t *)
                               it.super_const_iterator.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_true>
                               ._M_cur);
      bVar1 = std::__detail::operator!=(&local_28,&local_38);
      if (bVar1) {
        std::operator<<(os," : ");
      }
      attr_00 = attributes_t::const_iterator_t::operator*((const_iterator_t *)&local_28);
      operator<<(os,attr_00);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_false,_true>
                    *)&local_28);
    }
    std::operator<<(os,"}");
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::parsing::attributes_t const & attr)
{
  if (attr.size() == 0)
    return os;

  os << "{";
  for (auto it = attr.begin(); it != attr.end(); ++it) {
    if (it != attr.begin())
      os << " : ";
    os << *it;
  }
  os << "}";
  return os;
}